

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::NormalGetRealName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  string msg;
  Names local_118;
  cmAlphaNum local_58;
  
  bVar2 = IsImported(this);
  if (bVar2) {
    local_118.Base._M_dataplus._M_p = (pointer)0x2d;
    local_118.Base._M_string_length = 0x64d1c1;
    psVar4 = GetName_abi_cxx11_(this);
    local_58.View_._M_str = (psVar4->_M_dataplus)._M_p;
    local_58.View_._M_len = psVar4->_M_string_length;
    cmStrCat<>(&msg,(cmAlphaNum *)&local_118,&local_58);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  TVar3 = GetType(this);
  if (TVar3 == EXECUTABLE) {
    GetExecutableNames(&local_118,this,config);
  }
  else {
    GetLibraryNames(&local_118,this,config);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar1 = &local_118.Real.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.Real._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_118.Real.field_2._M_allocated_capacity._1_7_,
                  local_118.Real.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_118.Real.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_118.Real._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_118.Real.field_2._M_allocated_capacity._1_7_,
                  local_118.Real.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_118.Real._M_string_length;
  local_118.Real._M_string_length = 0;
  local_118.Real.field_2._M_local_buf[0] = '\0';
  local_118.Real._M_dataplus._M_p = (pointer)paVar1;
  Names::~Names(&local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetRealName(
  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = cmStrCat("NormalGetRealName called on imported target: ",
                               this->GetName());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Compute the real name that will be built.
    return this->GetExecutableNames(config).Real;
  }
  // Compute the real name that will be built.
  return this->GetLibraryNames(config).Real;
}